

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O3

void __thiscall
icu_63::TailoredSet::compare(TailoredSet *this,UChar32 c,uint32_t ce32,uint32_t baseCE32)

{
  UChar *pUVar1;
  UBool UVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  undefined2 *puVar9;
  CollationData *d;
  UChar *pUVar10;
  
  if ((ce32 & 0xcf) == 200) {
    pUVar10 = this->data->contexts + (ce32 >> 0xd);
    ce32 = CollationData::getFinalCE32(this->data,CONCAT22(*pUVar10,pUVar10[1]));
    if ((baseCE32 & 0xcf) == 200) {
      pUVar1 = this->baseData->contexts + (baseCE32 >> 0xd);
      baseCE32 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar1,pUVar1[1]));
      comparePrefixes(this,c,pUVar10 + 2,pUVar1 + 2);
    }
    else {
      d = this->data;
LAB_0023d53f:
      addPrefixes(this,d,c,pUVar10 + 2);
    }
  }
  else if ((baseCE32 & 0xcf) == 200) {
    pUVar10 = this->baseData->contexts + (baseCE32 >> 0xd);
    baseCE32 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar10,pUVar10[1]));
    d = this->baseData;
    goto LAB_0023d53f;
  }
  if ((ce32 & 0xcf) == 0xc9) {
    pUVar10 = (UChar *)((ulong)(ce32 >> 0xc & 0xfffffffe) + (long)this->data->contexts);
    uVar4 = ce32 >> 8;
    ce32 = 1;
    if ((uVar4 & 1) == 0) {
      ce32 = CollationData::getFinalCE32(this->data,CONCAT22(*pUVar10,pUVar10[1]));
    }
    if ((baseCE32 & 0xcf) == 0xc9) {
      puVar9 = (undefined2 *)
               ((ulong)(baseCE32 >> 0xc & 0xfffffffe) + (long)this->baseData->contexts);
      uVar4 = baseCE32 >> 8;
      baseCE32 = 1;
      if ((uVar4 & 1) == 0) {
        baseCE32 = CollationData::getFinalCE32(this->baseData,CONCAT22(*puVar9,puVar9[1]));
      }
      compareContractions(this,c,pUVar10 + 2,puVar9 + 2);
    }
    else {
LAB_0023d642:
      addContractions(this,c,pUVar10 + 2);
    }
  }
  else if ((baseCE32 & 0xcf) == 0xc9) {
    pUVar10 = this->baseData->contexts + (baseCE32 >> 0xd);
    baseCE32 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar10,pUVar10[1]));
    goto LAB_0023d642;
  }
  uVar4 = 0xffffffff;
  if (((~baseCE32 & 0xc0) == 0) && (uVar4 = baseCE32 & 0xf, uVar4 == 0xe)) {
    if ((ce32 & 0xcf) != 0xc1) goto LAB_0023d849;
    uVar3 = Collation::getThreeBytePrimaryForOffsetData(c,this->baseData->ces[baseCE32 >> 0xd]);
    uVar4 = 0xe;
    if ((ce32 & 0xffffff00) != uVar3) goto LAB_0023d849;
  }
  uVar6 = -(uint)((~ce32 & 0xc0) != 0) | ce32 & 0xf;
  if (uVar6 == uVar4) {
    if (uVar6 == 0xc) {
      iVar8 = c + -0xac00;
      UVar2 = UnicodeSet::contains
                        (this->tailored,
                         ((uint)((ulong)((long)iVar8 * 0x6f74ae27) >> 0x28) - (iVar8 >> 0x1f)) +
                         0x1100 & 0xffff);
      if (UVar2 == '\0') {
        iVar7 = (int)((ulong)((long)iVar8 * -0x6db6db6d) >> 0x20) + c + -0xac00;
        iVar7 = (iVar7 >> 4) - (iVar7 >> 0x1f);
        UVar2 = UnicodeSet::contains(this->tailored,iVar7 % 0x15 + 0x1161);
        if (UVar2 == '\0') {
          iVar8 = iVar8 + iVar7 * -0x1c;
          if (iVar8 == 0) {
            return;
          }
          UVar2 = UnicodeSet::contains(this->tailored,iVar8 + 0x11a7);
          if (UVar2 == '\0') {
            return;
          }
        }
      }
    }
    else if (uVar6 == 6) {
      uVar4 = ce32 >> 8 & 0x1f;
      if (uVar4 == (baseCE32 >> 8 & 0x1f)) {
        if (uVar4 == 0) {
          return;
        }
        uVar5 = 0;
        while (*(long *)((long)this->data->ces + uVar5 * 8 + (ulong)(ce32 >> 10 & 0xfffffff8)) ==
               *(long *)((long)this->baseData->ces +
                        uVar5 * 8 + (ulong)(baseCE32 >> 10 & 0xfffffff8))) {
          uVar5 = uVar5 + 1;
          if (uVar4 == uVar5) {
            return;
          }
        }
      }
    }
    else if (uVar6 == 5) {
      uVar4 = ce32 >> 8 & 0x1f;
      if (uVar4 == (baseCE32 >> 8 & 0x1f)) {
        if (uVar4 != 0) {
          uVar5 = 0;
          do {
            if (*(int *)((long)this->data->ce32s + uVar5 * 4 + (ulong)(ce32 >> 0xb & 0xfffffffc)) !=
                *(int *)((long)this->baseData->ce32s +
                        uVar5 * 4 + (ulong)(baseCE32 >> 0xb & 0xfffffffc))) goto LAB_0023d849;
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        return;
      }
    }
    else if (ce32 == baseCE32) {
      return;
    }
  }
LAB_0023d849:
  add(this,c);
  return;
}

Assistant:

void
TailoredSet::compare(UChar32 c, uint32_t ce32, uint32_t baseCE32) {
    if(Collation::isPrefixCE32(ce32)) {
        const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
        ce32 = data->getFinalCE32(CollationData::readCE32(p));
        if(Collation::isPrefixCE32(baseCE32)) {
            const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
            baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
            comparePrefixes(c, p + 2, q + 2);
        } else {
            addPrefixes(data, c, p + 2);
        }
    } else if(Collation::isPrefixCE32(baseCE32)) {
        const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
        baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
        addPrefixes(baseData, c, q + 2);
    }

    if(Collation::isContractionCE32(ce32)) {
        const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
        if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
            ce32 = Collation::NO_CE32;
        } else {
            ce32 = data->getFinalCE32(CollationData::readCE32(p));
        }
        if(Collation::isContractionCE32(baseCE32)) {
            const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
            if((baseCE32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
                baseCE32 = Collation::NO_CE32;
            } else {
                baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
            }
            compareContractions(c, p + 2, q + 2);
        } else {
            addContractions(c, p + 2);
        }
    } else if(Collation::isContractionCE32(baseCE32)) {
        const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
        baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
        addContractions(c, q + 2);
    }

    int32_t tag;
    if(Collation::isSpecialCE32(ce32)) {
        tag = Collation::tagFromCE32(ce32);
        U_ASSERT(tag != Collation::PREFIX_TAG);
        U_ASSERT(tag != Collation::CONTRACTION_TAG);
        // Currently, the tailoring data builder does not write offset tags.
        // They might be useful for saving space,
        // but they would complicate the builder,
        // and in tailorings we assume that performance of tailored characters is more important.
        U_ASSERT(tag != Collation::OFFSET_TAG);
    } else {
        tag = -1;
    }
    int32_t baseTag;
    if(Collation::isSpecialCE32(baseCE32)) {
        baseTag = Collation::tagFromCE32(baseCE32);
        U_ASSERT(baseTag != Collation::PREFIX_TAG);
        U_ASSERT(baseTag != Collation::CONTRACTION_TAG);
    } else {
        baseTag = -1;
    }

    // Non-contextual mappings, expansions, etc.
    if(baseTag == Collation::OFFSET_TAG) {
        // We might be comparing a tailoring CE which is a copy of
        // a base offset-tag CE, via the [optimize [set]] syntax
        // or when a single-character mapping was copied for tailored contractions.
        // Offset tags always result in long-primary CEs,
        // with common secondary/tertiary weights.
        if(!Collation::isLongPrimaryCE32(ce32)) {
            add(c);
            return;
        }
        int64_t dataCE = baseData->ces[Collation::indexFromCE32(baseCE32)];
        uint32_t p = Collation::getThreeBytePrimaryForOffsetData(c, dataCE);
        if(Collation::primaryFromLongPrimaryCE32(ce32) != p) {
            add(c);
            return;
        }
    }

    if(tag != baseTag) {
        add(c);
        return;
    }

    if(tag == Collation::EXPANSION32_TAG) {
        const uint32_t *ce32s = data->ce32s + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);

        const uint32_t *baseCE32s = baseData->ce32s + Collation::indexFromCE32(baseCE32);
        int32_t baseLength = Collation::lengthFromCE32(baseCE32);

        if(length != baseLength) {
            add(c);
            return;
        }
        for(int32_t i = 0; i < length; ++i) {
            if(ce32s[i] != baseCE32s[i]) {
                add(c);
                break;
            }
        }
    } else if(tag == Collation::EXPANSION_TAG) {
        const int64_t *ces = data->ces + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);

        const int64_t *baseCEs = baseData->ces + Collation::indexFromCE32(baseCE32);
        int32_t baseLength = Collation::lengthFromCE32(baseCE32);

        if(length != baseLength) {
            add(c);
            return;
        }
        for(int32_t i = 0; i < length; ++i) {
            if(ces[i] != baseCEs[i]) {
                add(c);
                break;
            }
        }
    } else if(tag == Collation::HANGUL_TAG) {
        UChar jamos[3];
        int32_t length = Hangul::decompose(c, jamos);
        if(tailored->contains(jamos[0]) || tailored->contains(jamos[1]) ||
                (length == 3 && tailored->contains(jamos[2]))) {
            add(c);
        }
    } else if(ce32 != baseCE32) {
        add(c);
    }
}